

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transform.cpp
# Opt level: O0

Transform * __thiscall sf::Transform::rotate(Transform *this,float angle)

{
  Transform *pTVar1;
  Transform *in_RDI;
  float in_XMM0_Da;
  double dVar2;
  Transform *unaff_retaddr;
  Transform rotation;
  float sin;
  float cos;
  float rad;
  Transform local_58;
  float local_18;
  float local_14;
  float local_10;
  
  local_10 = (in_XMM0_Da * 3.1415927) / 180.0;
  dVar2 = std::cos((double)(ulong)(uint)local_10);
  local_14 = SUB84(dVar2,0);
  dVar2 = std::sin((double)(ulong)(uint)local_10);
  local_18 = SUB84(dVar2,0);
  Transform(&local_58,local_14,-local_18,0.0,local_18,local_14,0.0,0.0,0.0,1.0);
  pTVar1 = combine(unaff_retaddr,in_RDI);
  return pTVar1;
}

Assistant:

Transform& Transform::rotate(float angle)
{
    float rad = angle * 3.141592654f / 180.f;
    float cos = std::cos(rad);
    float sin = std::sin(rad);

    Transform rotation(cos, -sin, 0,
                       sin,  cos, 0,
                       0,    0,   1);

    return combine(rotation);
}